

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

int32_t utrie2_serialize_63(UTrie2 *trie,void *data,int32_t capacity,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  int32_t capacity_local;
  void *data_local;
  UTrie2 *trie_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((((trie == (UTrie2 *)0x0) || (trie->memory == (void *)0x0)) ||
         (trie->newTrie != (UNewTrie2 *)0x0)) || (capacity < 0)) ||
       ((0 < capacity && ((data == (void *)0x0 || (((ulong)data & 3) != 0)))))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      trie_local._4_4_ = 0;
    }
    else {
      if (capacity < trie->length) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        memcpy(data,trie->memory,(long)trie->length);
      }
      trie_local._4_4_ = trie->length;
    }
  }
  else {
    trie_local._4_4_ = 0;
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_serialize(const UTrie2 *trie,
                 void *data, int32_t capacity,
                 UErrorCode *pErrorCode) {
    /* argument check */
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( trie==NULL || trie->memory==NULL || trie->newTrie!=NULL ||
        capacity<0 || (capacity>0 && (data==NULL || (U_POINTER_MASK_LSB(data, 3)!=0)))
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(capacity>=trie->length) {
        uprv_memcpy(data, trie->memory, trie->length);
    } else {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
    return trie->length;
}